

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O0

MPP_RET mpp_dec_start(MppDec ctx)

{
  MPP_RET local_1c;
  MPP_RET ret;
  MppDecImpl *dec;
  MppDec ctx_local;
  
  local_1c = MPP_OK;
  if ((mpp_dec_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_dec","%p in\n","mpp_dec_start",ctx);
  }
  if ((*(long *)((long)ctx + 8) != 0) && (**(long **)((long)ctx + 8) != 0)) {
    local_1c = (*(code *)**(undefined8 **)((long)ctx + 8))(ctx);
  }
  if ((mpp_dec_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_dec","%p out ret %d\n","mpp_dec_start",ctx,(ulong)(uint)local_1c);
  }
  return local_1c;
}

Assistant:

MPP_RET mpp_dec_start(MppDec ctx)
{
    MppDecImpl *dec = (MppDecImpl *)ctx;
    MPP_RET ret = MPP_OK;

    dec_dbg_func("%p in\n", dec);

    if (dec->api && dec->api->start)
        ret = dec->api->start(dec);

    dec_dbg_func("%p out ret %d\n", dec, ret);
    return ret;
}